

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall LongReadsMapper::write_read_paths(LongReadsMapper *this,string *filename)

{
  string *in_RSI;
  ofstream ofs;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_stack_fffffffffffffde8;
  ofstream *in_stack_fffffffffffffdf0;
  
  std::ofstream::ofstream(&stack0xfffffffffffffdf0,in_RSI,_S_bin);
  sdglib::write_flat_vectorvector<long>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::ofstream::~ofstream(&stack0xfffffffffffffdf0);
  return;
}

Assistant:

void LongReadsMapper::write_read_paths(std::string filename) {
    std::ofstream ofs(filename, std::ios_base::binary);
    sdglib::write_flat_vectorvector(ofs, read_paths);
}